

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.cpp
# Opt level: O2

void cut(ISegment *seg,char *filePath)

{
  pointer this;
  pointer begin;
  int iVar1;
  istream *piVar2;
  ostream *poVar3;
  string *in_R8;
  allocator local_2b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string line;
  string local_278;
  undefined1 local_258 [32];
  ifstream ifile;
  
  std::ifstream::ifstream(&ifile,filePath,_S_in);
  res.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  res.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  res.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifile,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    if (line._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&res);
      iVar1 = (*seg->_vptr_ISegment[5])(seg,&line,&res);
      begin = res.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      this = res.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if ((char)iVar1 == '\0') {
        std::__cxx11::string::string((string *)&local_278,"seg cut failed.",(allocator *)local_258);
        Limonp::Logger::LoggingF(3,"segment.cpp",0x1b,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
      }
      else {
        std::__cxx11::string::string((string *)local_258,"/",&local_2b9);
        Limonp::
        join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_278,(Limonp *)this,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,in_R8);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_278);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)local_258);
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&res);
  std::ifstream::~ifstream(&ifile);
  return;
}

Assistant:

void cut(const ISegment * seg, const char * const filePath)
{
    ifstream ifile(filePath);
    vector<string> res;
    string line;
    while(getline(ifile, line))
    {
        if(!line.empty())
        {
            cout << line << endl;
            res.clear();
            if(!seg->cut(line, res))
            {
                LogError("seg cut failed.");
            }
            else
            {
                print(join(res.begin(), res.end(), "/"));
            }
        }
    }
}